

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall parser::memo::any::bind<hwl::Variable>(any *this,Variable *v)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  
  if (this->p == (dyn *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*this->p->_vptr_dyn[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 != "N3hwl8VariableE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"N3hwl8VariableE");
      if (iVar1 == 0) goto LAB_00136f28;
    }
    return;
  }
LAB_00136f28:
  std::__cxx11::string::_M_assign((string *)v);
  std::__cxx11::string::_M_assign((string *)&v->value);
  return;
}

Assistant:

void bind(T& v) {
				if ( type() == typeid(T) ) {
					v = static_cast<of<T>*>(p)->v;
				}
			}